

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrCompositionLayerEquirect2KHR *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  XrCompositionLayerEquirect2KHR *pXVar1;
  byte bVar2;
  XrStructureType XVar3;
  XrEyeVisibility XVar4;
  pointer pcVar5;
  PFN_xrStructureTypeToString p_Var6;
  void *value_00;
  XrStructureType __val;
  XrEyeVisibility __val_00;
  uint uVar7;
  char cVar8;
  bool bVar9;
  char *pcVar10;
  XrInstance pXVar11;
  invalid_argument *piVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  char cVar18;
  XrGeneratedDispatchTable *pXVar19;
  string subimage_prefix;
  string next_prefix;
  string type_prefix;
  string eyevisibility_prefix;
  string space_prefix;
  string layerflags_prefix;
  string pose_prefix;
  string lowerverticalangle_prefix;
  string upperverticalangle_prefix;
  string centralhorizontalangle_prefix;
  string radius_prefix;
  ostringstream oss_space;
  ostringstream oss_radius;
  ostringstream oss_lowerVerticalAngle;
  ostringstream oss_upperVerticalAngle;
  ostringstream oss_centralHorizontalAngle;
  long *local_9a8;
  long local_9a0;
  long local_998 [2];
  long *local_988;
  long local_980;
  long local_978 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  long *local_8e8;
  long local_8e0;
  long local_8d8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  undefined1 local_848 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_838;
  string local_828;
  undefined1 local_808 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7f8;
  string local_7e8;
  string local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  PFN_xrEnumerateViewConfigurations local_768;
  PFN_xrGetViewConfigurationProperties p_Stack_760;
  PFN_xrEnumerateViewConfigurationViews local_758;
  PFN_xrEnumerateSwapchainFormats p_Stack_750;
  ios_base local_718 [264];
  undefined1 local_610 [112];
  ios_base local_5a0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498 [3];
  ios_base local_428 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [3];
  ios_base local_2b0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
  local_610._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_788,'\x12');
  *local_788._M_dataplus._M_p = '0';
  local_788._M_dataplus._M_p[1] = 'x';
  pcVar10 = local_788._M_dataplus._M_p + local_788._M_string_length + -1;
  lVar14 = 0;
  do {
    bVar2 = local_610[lVar14];
    *pcVar10 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar10[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar14 = lVar14 + 1;
    pcVar10 = pcVar10 + -2;
  } while (lVar14 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_788);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_968,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_968);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar3 = value->type;
    __val = -XVar3;
    if (0 < (int)XVar3) {
      __val = XVar3;
    }
    uVar17 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar16 = (ulong)__val;
      uVar7 = 4;
      do {
        uVar17 = uVar7;
        uVar13 = (uint)uVar16;
        if (uVar13 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_0013722b;
        }
        if (uVar13 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_0013722b;
        }
        if (uVar13 < 10000) goto LAB_0013722b;
        uVar16 = uVar16 / 10000;
        uVar7 = uVar17 + 4;
      } while (99999 < uVar13);
      uVar17 = uVar17 + 1;
    }
LAB_0013722b:
    local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_788,(char)uVar17 - (char)((int)XVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_788._M_dataplus._M_p + (XVar3 >> 0x1f),uVar17,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_968,&local_788);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_788._M_dataplus._M_p != &local_788.field_2) {
      operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_758 = (PFN_xrEnumerateViewConfigurationViews)0x0;
    p_Stack_750 = (PFN_xrEnumerateSwapchainFormats)0x0;
    local_768 = (PFN_xrEnumerateViewConfigurations)0x0;
    p_Stack_760 = (PFN_xrGetViewConfigurationProperties)0x0;
    local_788.field_2._M_allocated_capacity = 0;
    local_788.field_2._8_8_ = 0;
    local_788._M_dataplus._M_p = (pointer)0x0;
    local_788._M_string_length = 0;
    p_Var6 = gen_dispatch_table->StructureTypeToString;
    pXVar11 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var6)(pXVar11,value->type,(char *)&local_788);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_968,(char (*) [64])&local_788);
  }
  local_988 = local_978;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_988,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_988);
  value_00 = value->next;
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7c8,local_988,local_980 + (long)local_988);
  bVar9 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_7c8,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar9) {
    piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar12,"Invalid Operation");
    __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_908,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_908);
  uVar16 = value->layerFlags;
  cVar18 = '\x01';
  if (9 < uVar16) {
    uVar15 = uVar16;
    cVar8 = '\x04';
    do {
      cVar18 = cVar8;
      if (uVar15 < 100) {
        cVar18 = cVar18 + -2;
        goto LAB_001373da;
      }
      if (uVar15 < 1000) {
        cVar18 = cVar18 + -1;
        goto LAB_001373da;
      }
      if (uVar15 < 10000) goto LAB_001373da;
      bVar9 = 99999 < uVar15;
      uVar15 = uVar15 / 10000;
      cVar8 = cVar18 + '\x04';
    } while (bVar9);
    cVar18 = cVar18 + '\x01';
  }
LAB_001373da:
  local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_788,cVar18);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_788._M_dataplus._M_p,(uint)local_788._M_string_length,uVar16);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[24],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [24])"XrCompositionLayerFlags",&local_908,&local_788);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
  }
  local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_928,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_928);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_788);
  *(uint *)((long)&local_788.field_2 + *(long *)(local_788._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_788.field_2 + *(long *)(local_788._M_dataplus._M_p + -0x18) + 8) &
       0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(&local_788);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[8],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [8])"XrSpace",&local_928,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610);
  pXVar1 = (XrCompositionLayerEquirect2KHR *)(local_610 + 0x10);
  if ((XrCompositionLayerEquirect2KHR *)local_610._0_8_ != pXVar1) {
    operator_delete((void *)local_610._0_8_,local_610._16_8_ + 1);
  }
  local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_948,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_948);
  XVar4 = value->eyeVisibility;
  __val_00 = -XVar4;
  if (0 < (int)XVar4) {
    __val_00 = XVar4;
  }
  uVar17 = 1;
  if (9 < __val_00) {
    uVar16 = (ulong)__val_00;
    uVar7 = 4;
    do {
      uVar17 = uVar7;
      uVar13 = (uint)uVar16;
      if (uVar13 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_001375a5;
      }
      if (uVar13 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_001375a5;
      }
      if (uVar13 < 10000) goto LAB_001375a5;
      uVar16 = uVar16 / 10000;
      uVar7 = uVar17 + 4;
    } while (99999 < uVar13);
    uVar17 = uVar17 + 1;
  }
LAB_001375a5:
  local_610._0_8_ = pXVar1;
  std::__cxx11::string::_M_construct((ulong)local_610,(char)uVar17 - (char)((int)XVar4 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_610._0_8_ + (ulong)(XVar4 >> 0x1f)),uVar17,__val_00);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [16])"XrEyeVisibility",&local_948,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610);
  if ((XrCompositionLayerEquirect2KHR *)local_610._0_8_ != pXVar1) {
    operator_delete((void *)local_610._0_8_,local_610._16_8_ + 1);
  }
  local_9a8 = local_998;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_9a8,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_9a8);
  local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7e8,local_9a8,local_9a0 + (long)local_9a8);
  pXVar19 = (XrGeneratedDispatchTable *)local_808;
  local_808._0_8_ = local_808 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)pXVar19,"XrSwapchainSubImage","");
  bVar9 = ApiDumpOutputXrStruct
                    (pXVar19,&value->subImage,&local_7e8,(string *)local_808,false,contents);
  if ((undefined1 *)local_808._0_8_ != local_808 + 0x10) {
    operator_delete((void *)local_808._0_8_,(ulong)(local_7f8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
    operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
  }
  if (bVar9) {
    pcVar5 = (prefix->_M_dataplus)._M_p;
    local_8e8 = local_8d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_8e8,pcVar5,pcVar5 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_8e8);
    local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_828,local_8e8,local_8e0 + (long)local_8e8);
    pXVar19 = (XrGeneratedDispatchTable *)local_848;
    local_848._0_8_ = local_848 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)pXVar19,"XrPosef","");
    bVar9 = ApiDumpOutputXrStruct
                      (pXVar19,&value->pose,&local_828,(string *)local_848,false,contents);
    if ((undefined1 *)local_848._0_8_ != local_848 + 0x10) {
      operator_delete((void *)local_848._0_8_,(ulong)(local_838._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_828._M_dataplus._M_p != &local_828.field_2) {
      operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
    }
    if (bVar9) {
      pcVar5 = (prefix->_M_dataplus)._M_p;
      local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_868,pcVar5,pcVar5 + prefix->_M_string_length);
      std::__cxx11::string::append((char *)&local_868);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
      *(undefined8 *)(local_610 + *(long *)(local_610._0_8_ + -0x18) + 8) = 0x20;
      std::ostream::_M_insert<double>((double)value->radius);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [6])"float",&local_868,local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,
                        (ulong)(local_1a8[0].field_2._M_allocated_capacity + 1));
      }
      pcVar5 = (prefix->_M_dataplus)._M_p;
      local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_888,pcVar5,pcVar5 + prefix->_M_string_length);
      std::__cxx11::string::append((char *)&local_888);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      *(undefined8 *)
       ((long)&local_1a8[0]._M_string_length + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18)) =
           0x20;
      std::ostream::_M_insert<double>((double)value->centralHorizontalAngle);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [6])"float",&local_888,local_320);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
        operator_delete(local_320[0]._M_dataplus._M_p,
                        (ulong)(local_320[0].field_2._M_allocated_capacity + 1));
      }
      pcVar5 = (prefix->_M_dataplus)._M_p;
      local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_8a8,pcVar5,pcVar5 + prefix->_M_string_length);
      std::__cxx11::string::append((char *)&local_8a8);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
      *(undefined8 *)
       ((long)&local_320[0]._M_string_length + *(long *)(local_320[0]._M_dataplus._M_p + -0x18)) =
           0x20;
      std::ostream::_M_insert<double>((double)value->upperVerticalAngle);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [6])"float",&local_8a8,local_498);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
        operator_delete(local_498[0]._M_dataplus._M_p,
                        (ulong)(local_498[0].field_2._M_allocated_capacity + 1));
      }
      pcVar5 = (prefix->_M_dataplus)._M_p;
      local_8c8._M_dataplus._M_p = (pointer)&local_8c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_8c8,pcVar5,pcVar5 + prefix->_M_string_length);
      std::__cxx11::string::append((char *)&local_8c8);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
      *(undefined8 *)
       ((long)&local_498[0]._M_string_length + *(long *)(local_498[0]._M_dataplus._M_p + -0x18)) =
           0x20;
      std::ostream::_M_insert<double>((double)value->lowerVerticalAngle);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [6])"float",&local_8c8,&local_7a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
        operator_delete(local_7a8._M_dataplus._M_p,
                        (ulong)(local_7a8.field_2._M_allocated_capacity + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
      std::ios_base::~ios_base(local_428);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
        operator_delete(local_8c8._M_dataplus._M_p,local_8c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
      std::ios_base::~ios_base(local_2b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
        operator_delete(local_8a8._M_dataplus._M_p,local_8a8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_888._M_dataplus._M_p != &local_888.field_2) {
        operator_delete(local_888._M_dataplus._M_p,local_888.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
      std::ios_base::~ios_base(local_5a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_868._M_dataplus._M_p != &local_868.field_2) {
        operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
      }
      if (local_8e8 != local_8d8) {
        operator_delete(local_8e8,local_8d8[0] + 1);
      }
      if (local_9a8 != local_998) {
        operator_delete(local_9a8,local_998[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_948._M_dataplus._M_p != &local_948.field_2) {
        operator_delete(local_948._M_dataplus._M_p,local_948.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_788);
      std::ios_base::~ios_base(local_718);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_928._M_dataplus._M_p != &local_928.field_2) {
        operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_908._M_dataplus._M_p != &local_908.field_2) {
        operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
      }
      if (local_988 != local_978) {
        operator_delete(local_988,local_978[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_968._M_dataplus._M_p != &local_968.field_2) {
        operator_delete(local_968._M_dataplus._M_p,local_968.field_2._M_allocated_capacity + 1);
      }
      return true;
    }
    piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar12,"Invalid Operation");
    __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar12,"Invalid Operation");
  __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrCompositionLayerEquirect2KHR* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string layerflags_prefix = prefix;
        layerflags_prefix += "layerFlags";
        contents.emplace_back("XrCompositionLayerFlags", layerflags_prefix, std::to_string(value->layerFlags));
        std::string space_prefix = prefix;
        space_prefix += "space";
        std::ostringstream oss_space;
        oss_space << std::hex << reinterpret_cast<const void*>(value->space);
        contents.emplace_back("XrSpace", space_prefix, oss_space.str());
        std::string eyevisibility_prefix = prefix;
        eyevisibility_prefix += "eyeVisibility";
        contents.emplace_back("XrEyeVisibility", eyevisibility_prefix, std::to_string(value->eyeVisibility));
        std::string subimage_prefix = prefix;
        subimage_prefix += "subImage";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->subImage, subimage_prefix, "XrSwapchainSubImage", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string pose_prefix = prefix;
        pose_prefix += "pose";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->pose, pose_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string radius_prefix = prefix;
        radius_prefix += "radius";
        std::ostringstream oss_radius;
        oss_radius << std::setprecision(32) << (value->radius);
        contents.emplace_back("float", radius_prefix, oss_radius.str());
        std::string centralhorizontalangle_prefix = prefix;
        centralhorizontalangle_prefix += "centralHorizontalAngle";
        std::ostringstream oss_centralHorizontalAngle;
        oss_centralHorizontalAngle << std::setprecision(32) << (value->centralHorizontalAngle);
        contents.emplace_back("float", centralhorizontalangle_prefix, oss_centralHorizontalAngle.str());
        std::string upperverticalangle_prefix = prefix;
        upperverticalangle_prefix += "upperVerticalAngle";
        std::ostringstream oss_upperVerticalAngle;
        oss_upperVerticalAngle << std::setprecision(32) << (value->upperVerticalAngle);
        contents.emplace_back("float", upperverticalangle_prefix, oss_upperVerticalAngle.str());
        std::string lowerverticalangle_prefix = prefix;
        lowerverticalangle_prefix += "lowerVerticalAngle";
        std::ostringstream oss_lowerVerticalAngle;
        oss_lowerVerticalAngle << std::setprecision(32) << (value->lowerVerticalAngle);
        contents.emplace_back("float", lowerverticalangle_prefix, oss_lowerVerticalAngle.str());
        return true;
    } catch(...) {
    }
    return false;
}